

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O3

int re_doreplace(RSIZE plen,char *st)

{
  byte bVar1;
  line *plVar2;
  int iVar3;
  size_t __n;
  uint uVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  byte local_148 [8];
  char repstr [256];
  
  plVar2 = curwp->w_dotp;
  iVar3 = 0;
  uVar4 = 0;
  iVar6 = 0;
LAB_00115a6b:
  do {
    pbVar7 = (byte *)st;
    while( true ) {
      st = (char *)(pbVar7 + 1);
      bVar1 = *pbVar7;
      if (iVar3 != 2) break;
      if ((byte)(bVar1 - 0x30) < 10) {
        uVar4 = ((uint)bVar1 + uVar4 * 10) - 0x30;
        iVar3 = 2;
        goto LAB_00115a6b;
      }
      if (9 < (int)uVar4) {
        return 0;
      }
      __n = (long)regex_match[(int)uVar4].rm_eo - (long)regex_match[(int)uVar4].rm_so;
      iVar5 = (int)__n + iVar6;
      if (0xff < iVar5) {
        return 0;
      }
      memmove(local_148 + iVar6,plVar2->l_text + regex_match[(int)uVar4].rm_so,__n);
      bVar1 = *pbVar7;
      iVar3 = 1;
      pbVar7 = (byte *)st;
      iVar6 = iVar5;
      if (bVar1 != 0x5c) {
        local_148[iVar5] = bVar1;
        if (iVar5 == 0xff) {
          return 0;
        }
        iVar6 = iVar5 + 1;
        iVar3 = 0;
        if (bVar1 == 0) goto LAB_00115b6e;
      }
    }
    if (iVar3 != 1) break;
    if (9 < (byte)(bVar1 - 0x30)) goto joined_r0x00115b36;
    uVar4 = (uint)(byte)(bVar1 - 0x30);
    iVar3 = 2;
  } while( true );
  iVar3 = 1;
  if (bVar1 != 0x5c) {
joined_r0x00115b36:
    if (bVar1 == 0) {
LAB_00115b6e:
      local_148[iVar6] = 0;
      iVar6 = lreplace(plen,(char *)local_148);
      return iVar6;
    }
    local_148[iVar6] = bVar1;
    if (0xfe < iVar6) {
      return 0;
    }
    iVar6 = iVar6 + 1;
    iVar3 = 0;
  }
  goto LAB_00115a6b;
}

Assistant:

static int
re_doreplace(RSIZE plen, char *st)
{
	int	 j, k, s, more, num, state;
	struct line	*clp;
	char	 repstr[REPLEN];

	clp = curwp->w_dotp;
	more = TRUE;
	j = 0;
	state = 0;
	num = 0;

	/* The following FSA parses the replacement string */
	while (more) {
		switch (state) {
		case 0:
			if (*st == '\\') {
				st++;
				state = 1;
			} else if (*st == '\0')
				more = FALSE;
			else {
				repstr[j] = *st;
				j++;
				if (j >= REPLEN)
					return (FALSE);
				st++;
			}
			break;
		case 1:
			if (*st >= '0' && *st <= '9') {
				num = *st - '0';
				st++;
				state = 2;
			} else if (*st == '\0')
				more = FALSE;
			else {
				repstr[j] = *st;
				j++;
				if (j >= REPLEN)
					return (FALSE);
				st++;
				state = 0;
			}
			break;
		case 2:
			if (*st >= '0' && *st <= '9') {
				num = 10 * num + *st - '0';
				st++;
			} else {
				if (num >= RE_NMATCH)
					return (FALSE);
				k = regex_match[num].rm_eo - regex_match[num].rm_so;
				if (j + k >= REPLEN)
					return (FALSE);
				bcopy(&(clp->l_text[regex_match[num].rm_so]),
				    &repstr[j], k);
				j += k;
				if (*st == '\0')
					more = FALSE;
				if (*st == '\\') {
					st++;
					state = 1;
				} else {
					repstr[j] = *st;
					j++;
					if (j >= REPLEN)
						return (FALSE);
					st++;
					state = 0;
				}
			}
			break;
		}		/* switch (state) */
	}			/* while (more)   */

	repstr[j] = '\0';
	s = lreplace(plen, repstr);
	return (s);
}